

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O0

err_t g12sEcCreate(ec_o **pec,g12s_params *params,g12s_deep_i deep)

{
  bool_t bVar1;
  octet *B;
  octet *A;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  qr_o *pqVar5;
  ec_o *ec_00;
  octet *xbase;
  undefined8 uVar6;
  blob_t pvVar7;
  void *stack_00;
  void *stack_01;
  ulong n_00;
  qr_o *in_RDX;
  ec_o *in_RSI;
  undefined8 *in_RDI;
  void *stack;
  ec_o *ec;
  qr_o *f;
  void *state;
  size_t ec_deep;
  size_t ec_keep;
  size_t ec_d;
  size_t f_deep;
  size_t f_keep;
  size_t nb;
  size_t no;
  size_t n;
  size_t in_stack_ffffffffffffff58;
  word *in_stack_ffffffffffffff60;
  qr_o *r;
  size_t in_stack_ffffffffffffffc8;
  err_t local_4;
  
  bVar1 = memIsValid(in_RSI,0x19c);
  if ((bVar1 == 0) || (((int)(in_RSI->hdr).keep != 0x100 && ((int)(in_RSI->hdr).keep != 0x200)))) {
    local_4 = 0x1f6;
  }
  else {
    B = (octet *)memNonZeroSize((void *)((long)&(in_RSI->hdr).keep + 4),
                                (ulong)(uint)(in_RSI->hdr).keep * 0x44 >> 9);
    A = (octet *)((ulong)(B + 7) >> 3);
    sVar2 = gfpCreate_keep(0x166ab1);
    sVar3 = gfpCreate_deep(0x166ac0);
    sVar4 = ecpCreateJ_keep((size_t)B);
    pqVar5 = (qr_o *)ecpCreateJ_deep(in_stack_ffffffffffffffc8,sVar2);
    ec_00 = (ec_o *)(sVar2 + sVar4);
    r = pqVar5;
    xbase = (octet *)ecCreateGroup_deep(sVar3);
    uVar6 = (*(code *)in_RDX)(A,sVar3,3,pqVar5);
    utilMax(3,r,xbase,uVar6);
    pvVar7 = blobCreate(in_stack_ffffffffffffff58);
    if (pvVar7 == (blob_t)0x0) {
      local_4 = 0x6e;
    }
    else {
      stack_00 = (void *)((long)pvVar7 + sVar4);
      sVar2 = (long)stack_00 + sVar2;
      bVar1 = gfpCreate(r,(octet *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        (void *)0x166bbb);
      if (bVar1 == 0) {
        blobClose((blob_t)0x166bca);
        local_4 = 0x1f6;
      }
      else {
        stack_01 = (void *)wwBitSize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        if ((((int)(in_RSI->hdr).keep == 0x100) && (stack_01 < (void *)0xfe)) ||
           (((int)(in_RSI->hdr).keep == 0x200 && (stack_01 < (void *)0x1fc)))) {
          blobClose((blob_t)0x166c35);
          local_4 = 0x1f6;
        }
        else {
          bVar1 = ecpCreateJ(in_RSI,in_RDX,A,B,stack_01);
          if ((bVar1 != 0) &&
             (bVar1 = ecCreateGroup(ec_00,xbase,(octet *)r,(octet *)in_stack_ffffffffffffff60,sVar2,
                                    0,stack_00), bVar1 != 0)) {
            n_00 = (ulong)((int)(in_RSI->hdr).keep + 0x3fU >> 6);
            sVar3 = wwBitSize(in_stack_ffffffffffffff60,sVar2);
            if ((((int)(in_RSI->hdr).keep != 0x100) || (0xfe < sVar3)) &&
               ((((int)(in_RSI->hdr).keep != 0x200 || (0x1fc < sVar3)) &&
                (bVar1 = zzIsEven(*(word **)((long)pvVar7 + 0x38),n_00), bVar1 == 0)))) {
              objAppend(xbase,r,(size_t)in_stack_ffffffffffffff60);
              *in_RDI = pvVar7;
              return 0;
            }
            blobClose((blob_t)0x166d96);
            return 0x1f6;
          }
          blobClose((blob_t)0x166cf3);
          local_4 = 0x1f6;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static err_t g12sEcCreate(
	ec_o** pec,						/* [out] описание эллиптической кривой */
	const g12s_params* params,		/* [in] долговременные параметры */
	g12s_deep_i deep				/* [in] потребности в стековой памяти */
)
{
	// размерности
	size_t n, no, nb;
	size_t f_keep;
	size_t f_deep;
	size_t ec_d;
	size_t ec_keep;
	size_t ec_deep;
	// состояние
	void* state;	
	qr_o* f;			/* базовое поле */
	ec_o* ec;			/* кривая */
	void* stack;
	// pre
	ASSERT(memIsValid(pec, sizeof(*pec)));
	// минимальная проверка входных данных
	if (!memIsValid(params, sizeof(g12s_params)) ||
		params->l != 256 && params->l != 512)
		return ERR_BAD_PARAMS;
	// определить размерности
	no = memNonZeroSize(params->p, sizeof(params->p) * params->l / 512);
	n = W_OF_O(no);
	f_keep = gfpCreate_keep(no);
	f_deep = gfpCreate_deep(no);
	ec_d = 3;
	ec_keep = ecpCreateJ_keep(no);
	ec_deep = ecpCreateJ_deep(no, f_deep);
	// создать состояние
	state = blobCreate(
		f_keep + ec_keep +
		utilMax(3,
			ec_deep,
			ecCreateGroup_deep(f_deep),
			deep(n, f_deep, ec_d, ec_deep)));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// создать поле
	f = (qr_o*)((octet*)state + ec_keep);
	stack = (octet*)f + f_keep;
	if (!gfpCreate(f, params->p, no, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// проверить длину p
	nb = wwBitSize(f->mod, n);
	if (params->l == 256 && nb <= 253 ||
		params->l == 512 && nb <= 507)
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// создать кривую и группу
	ec = (ec_o*)state;
	if (!ecpCreateJ(ec, f, params->a, params->b, stack) ||
		!ecCreateGroup(ec, params->xP, params->yP, params->q, 
			params->l / 8, params->n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// проверить q
	n = W_OF_B(params->l);
	nb = wwBitSize(ec->order, n);
	if (params->l == 256 && nb <= 254 ||
		params->l == 512 && nb <= 508 ||
		zzIsEven(ec->order, n))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// присоединить f к ec
	objAppend(ec, f, 0);
	// все нормально
	*pec = ec;
	return ERR_OK;
}